

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcSpace::~IfcSpace(IfcSpace *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)
   &this[-1].super_IfcSpatialStructureElement.super_IfcProduct.super_IfcObject.field_0x58 = 0x8c9a28
  ;
  *(undefined8 *)
   &(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.field_0x40 = 0x8c9b18;
  *(undefined8 *)
   &this[-1].super_IfcSpatialStructureElement.super_IfcProduct.super_IfcObject.field_0xe0 = 0x8c9a50
  ;
  this[-1].super_IfcSpatialStructureElement.super_IfcProduct.Representation.ptr.obj =
       (LazyObject *)0x8c9a78;
  *(undefined8 *)&this[-1].super_IfcSpatialStructureElement.field_0x128 = 0x8c9aa0;
  *(undefined8 *)&this[-1].super_IfcSpatialStructureElement.field_0x158 = 0x8c9ac8;
  *(undefined8 *)&(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject =
       0x8c9af0;
  puVar1 = *(undefined1 **)
            &(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.field_0x10;
  if (puVar1 != &(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.
                 field_0x20) {
    operator_delete(puVar1);
  }
  IfcSpatialStructureElement::~IfcSpatialStructureElement
            ((IfcSpatialStructureElement *)
             &this[-1].super_IfcSpatialStructureElement.super_IfcProduct.super_IfcObject.field_0x58,
             &PTR_construction_vtable_24__008c9b30);
  return;
}

Assistant:

IfcSpace() : Object("IfcSpace") {}